

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

string * __thiscall
flatbuffers::lobster::LobsterGenerator::NamespacedName_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Definition *def)

{
  Namespace *ns;
  string local_40;
  Definition *local_20;
  Definition *def_local;
  LobsterGenerator *this_local;
  
  ns = def->defined_namespace;
  local_20 = def;
  def_local = (Definition *)this;
  this_local = (LobsterGenerator *)__return_storage_ptr__;
  NormalizedName_abi_cxx11_(&local_40,this,def);
  BaseGenerator::WrapInNameSpace(__return_storage_ptr__,&this->super_BaseGenerator,ns,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedName(const Definition &def) {
    return WrapInNameSpace(def.defined_namespace, NormalizedName(def));
  }